

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

OnCallSpec<int_(int)> * __thiscall
testing::internal::FunctionMocker<int_(int)>::AddNewOnCallSpec
          (FunctionMocker<int_(int)> *this,char *file,int line,ArgumentMatcherTuple *m)

{
  VTable *pVVar1;
  SharedPayloadBase *pSVar2;
  void *mock_obj;
  OnCallSpec<int_(int)> *pOVar3;
  OnCallSpec<int_(int)> *local_30;
  
  mock_obj = UntypedFunctionMockerBase::MockObject(&this->super_UntypedFunctionMockerBase);
  Mock::RegisterUseByOnCallOrExpectCall(mock_obj,file,line);
  pOVar3 = (OnCallSpec<int_(int)> *)operator_new(0x60);
  (pOVar3->super_UntypedOnCallSpecBase).file_ = file;
  (pOVar3->super_UntypedOnCallSpecBase).line_ = line;
  (pOVar3->super_UntypedOnCallSpecBase).last_clause_ = kNone;
  pVVar1 = (m->super__Tuple_impl<0UL,_testing::Matcher<int>_>).
           super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
           vtable_;
  (pOVar3->matchers_).super__Tuple_impl<0UL,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.vtable_ =
       pVVar1;
  pSVar2 = (m->super__Tuple_impl<0UL,_testing::Matcher<int>_>).
           super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
           buffer_.shared;
  (pOVar3->matchers_).super__Tuple_impl<0UL,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.buffer_.
  shared = pSVar2;
  if ((pVVar1 != (VTable *)0x0) &&
     (pVVar1->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    (pSVar2->ref).super___atomic_base<int>._M_i = (pSVar2->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (pOVar3->matchers_).super__Tuple_impl<0UL,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00190378;
  (pOVar3->extra_matcher_).super_MatcherBase<const_std::tuple<int>_&>.vtable_ =
       (VTable *)
       MatcherBase<std::tuple<int>const&>::
       GetVTable<testing::internal::MatcherBase<std::tuple<int>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  (pOVar3->extra_matcher_).super_MatcherBase<const_std::tuple<int>_&>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001918c8;
  *(undefined8 *)&(pOVar3->action_).fun_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(pOVar3->action_).fun_.super__Function_base._M_functor + 8) = 0;
  (pOVar3->action_).fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  (pOVar3->action_).fun_._M_invoker = (_Invoker_type)0x0;
  local_30 = pOVar3;
  std::vector<void_const*,std::allocator<void_const*>>::emplace_back<void_const*>
            ((vector<void_const*,std::allocator<void_const*>> *)
             &(this->super_UntypedFunctionMockerBase).untyped_on_call_specs_,&local_30);
  return pOVar3;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    Mock::RegisterUseByOnCallOrExpectCall(MockObject(), file, line);
    OnCallSpec<F>* const on_call_spec = new OnCallSpec<F>(file, line, m);
    untyped_on_call_specs_.push_back(on_call_spec);
    return *on_call_spec;
  }